

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O3

void __thiscall
RangeLock_MoveConstruct_Test::~RangeLock_MoveConstruct_Test(RangeLock_MoveConstruct_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (RangeLock, MoveConstruct) {
    mock_file file;

    using ::testing::_;
    EXPECT_CALL (file, lock (_, _, _, _)).Times (0);
    EXPECT_CALL (file, unlock (_, _)).Times (0);

    pstore::file::range_lock lock1 (&file,
                                    UINT64_C (13),   // offset
                                    std::size_t{17}, // size
                                    mock_file::lock_kind::exclusive_write);
    pstore::file::range_lock lock2 = std::move (lock1);

// Clang SA (correctly) warns that this is (strictly) undefined behavior. However, the
// moved-from type is defined here and so is its behaviour that I would like to test.
#ifndef __clang_analyzer__
    // Check that lock1 was "destroyed" by the move
    EXPECT_EQ (nullptr, lock1.file ());
    EXPECT_FALSE (lock1.is_locked ());
#endif

    // Check that lock2 matches the state of lock1 before the move
    EXPECT_EQ (&file, lock2.file ());
    EXPECT_EQ (UINT64_C (13), lock2.offset ());
    EXPECT_EQ (std::size_t{17}, lock2.size ());
    EXPECT_EQ (mock_file::lock_kind::exclusive_write, lock2.kind ());
    EXPECT_FALSE (lock2.is_locked ());
}